

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
floatFromString(Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *__return_storage_ptr__,string *s)

{
  float fVar1;
  char *endptr;
  char *local_60;
  string local_58;
  char *local_38;
  size_type local_30;
  char local_28 [8];
  undefined8 uStack_20;
  
  local_60 = (char *)0x0;
  fVar1 = strtof((s->_M_dataplus)._M_p,&local_60);
  if ((s->_M_string_length == 0) || (*local_60 != '\0')) {
    format_abi_cxx11_(&local_58,"Cannot convert \'%s\' to float",(s->_M_dataplus)._M_p);
    local_38 = local_28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      uStack_20 = local_58.field_2._8_8_;
    }
    else {
      local_38 = local_58._M_dataplus._M_p;
    }
    local_30 = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    (__return_storage_ptr__->field_0).value_ = fVar1;
    __return_storage_ptr__->has_value_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<float, std::string> floatFromString(const std::string &s) {
		char *endptr = nullptr;
		const float ret = strtof(s.c_str(), &endptr);
		if (s.empty() || endptr[0] != '\0')
			return Unexpected(format("Cannot convert '%s' to float", s.c_str()));
		return ret;
}